

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmChk<(moira::Instr)35,(moira::Mode)9,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  byte *pbVar3;
  byte bVar4;
  StrWriter *pSVar5;
  char *pcVar6;
  char cVar7;
  Ea<(moira::Mode)9,_(moira::Size)2> src;
  Ea<(moira::Mode)9,_(moira::Size)2> local_2c;
  
  local_2c.reg = op & 7;
  local_2c.pc = *addr;
  *addr = local_2c.pc + 2;
  local_2c.ext1 = (*this->_vptr_Moira[5])();
  local_2c.ext1 = local_2c.ext1 & 0xffff;
  bVar4 = str->upper;
  pcVar6 = "chk";
  if ((bool)bVar4 != false) {
    pcVar6 = "CHK";
  }
  cVar7 = *pcVar6;
  if (cVar7 != '\0') {
    do {
      pcVar6 = pcVar6 + 1;
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = cVar7;
      cVar7 = *pcVar6;
    } while (cVar7 != '\0');
    bVar4 = str->upper;
  }
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = '.';
  pbVar3 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar3 + 1);
  *pbVar3 = (~bVar4 & 1) << 5 | 0x57;
  iVar1 = (this->tab).raw;
  while (pcVar6 = str->ptr, pcVar6 < str->base + iVar1) {
    str->ptr = pcVar6 + 1;
    *pcVar6 = ' ';
  }
  pSVar5 = StrWriter::operator<<(str,&local_2c);
  pcVar6 = pSVar5->ptr;
  pSVar5->ptr = pcVar6 + 1;
  *pcVar6 = ',';
  pcVar6 = pSVar5->ptr;
  pSVar5->ptr = pcVar6 + 1;
  *pcVar6 = ' ';
  pcVar6 = pSVar5->ptr;
  pSVar5->ptr = pcVar6 + 1;
  *pcVar6 = 'D';
  pbVar3 = (byte *)pSVar5->ptr;
  pSVar5->ptr = (char *)(pbVar3 + 1);
  *pbVar3 = (byte)(op >> 9) & 7 | 0x30;
  return;
}

Assistant:

void
Moira::dasmChk(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dst = Dn       ( ____xxx_________(op)       );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}